

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistage_vector_quantization.cc
# Opt level: O1

bool __thiscall
sptk::MultistageVectorQuantization::Run
          (MultistageVectorQuantization *this,vector<double,_std::allocator<double>_> *input_vector,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *codebook_vectors,vector<int,_std::allocator<int>_> *codebook_indices,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer __src;
  double *pdVar1;
  bool bVar2;
  double *pdVar3;
  size_t __n;
  double *pdVar4;
  size_type __new_size;
  bool bVar5;
  size_type __new_size_00;
  long lVar6;
  
  if ((this->is_valid_ == true) &&
     (__new_size_00 = (long)this->num_order_ + 1,
     (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish -
     (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start >> 3 == __new_size_00)) {
    bVar5 = false;
    if (((buffer != (Buffer *)0x0) &&
        (bVar5 = false, codebook_indices != (vector<int,_std::allocator<int>_> *)0x0)) &&
       (__new_size = (size_type)this->num_stage_,
       ((long)(codebook_vectors->
              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(codebook_vectors->
              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size ==
       0)) {
      if ((long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2 != __new_size) {
        std::vector<int,_std::allocator<int>_>::resize(codebook_indices,__new_size);
      }
      this_00 = &buffer->quantization_error_;
      if ((long)(buffer->quantization_error_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->quantization_error_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size_00) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size_00);
      }
      __src = (input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
      __n = (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,__src,__n);
      }
      bVar5 = this->num_stage_ < 1;
      if (0 < this->num_stage_) {
        bVar2 = VectorQuantization::Run
                          (&this->vector_quantization_,this_00,
                           (codebook_vectors->
                           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           (codebook_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                           .super__Vector_impl_data._M_start);
        if (bVar2) {
          lVar6 = 0;
          do {
            if (lVar6 < (long)this->num_stage_ + -1) {
              pdVar3 = (buffer->quantization_error_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar1 = (buffer->quantization_error_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (pdVar3 != pdVar1) {
                pdVar4 = *(double **)
                          (*(long *)&(codebook_vectors->
                                     super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[lVar6].
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data +
                          (long)(codebook_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start[lVar6] * 0x18);
                do {
                  *pdVar3 = *pdVar3 - *pdVar4;
                  pdVar3 = pdVar3 + 1;
                  pdVar4 = pdVar4 + 1;
                } while (pdVar3 != pdVar1);
              }
            }
            lVar6 = lVar6 + 1;
            bVar5 = this->num_stage_ <= lVar6;
          } while ((lVar6 < this->num_stage_) &&
                  (bVar2 = VectorQuantization::Run
                                     (&this->vector_quantization_,this_00,
                                      (codebook_vectors->
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar6,
                                      (codebook_indices->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data._M_start + lVar6), bVar2));
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool MultistageVectorQuantization::Run(
    const std::vector<double>& input_vector,
    const std::vector<std::vector<std::vector<double> > >& codebook_vectors,
    std::vector<int>* codebook_indices,
    MultistageVectorQuantization::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ || input_vector.size() != static_cast<std::size_t>(length) ||
      codebook_vectors.size() != static_cast<std::size_t>(num_stage_) ||
      NULL == codebook_indices || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (codebook_indices->size() != static_cast<std::size_t>(num_stage_)) {
    codebook_indices->resize(num_stage_);
  }
  if (buffer->quantization_error_.size() != static_cast<std::size_t>(length)) {
    buffer->quantization_error_.resize(length);
  }

  // Initialize quantization error.
  std::copy(input_vector.begin(), input_vector.end(),
            buffer->quantization_error_.begin());

  for (int n(0); n < num_stage_; ++n) {
    if (!vector_quantization_.Run(buffer->quantization_error_,
                                  codebook_vectors[n],
                                  &((*codebook_indices)[n]))) {
      return false;
    }

    if (n < num_stage_ - 1) {
      std::transform(buffer->quantization_error_.begin(),
                     buffer->quantization_error_.end(),
                     codebook_vectors[n][(*codebook_indices)[n]].begin(),
                     buffer->quantization_error_.begin(),
                     [](double e, double c) { return e - c; });
    }
  }

  return true;
}